

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
begin_document(basic_bson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
               *this,json_visitor *visitor,error_code *ec)

{
  _func_int *__nbytes;
  bson_errc __e;
  uint8_t buf [4];
  size_t n;
  parse_mode local_30;
  type_conflict4 length;
  
  __nbytes = (this->options_)._vptr_bson_decode_options[-3];
  if (*(int *)(__nbytes + 8 + (long)&(this->options_)._vptr_bson_decode_options) <
      (int)(((long)(this->state_stack_).
                   super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->state_stack_).
                  super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x28)) {
    __e = max_nesting_depth_exceeded;
  }
  else {
    n = stream_source<unsigned_char>::read(&this->source_,(int)buf,(void *)0x4,(size_t)__nbytes);
    if (n == 4) {
      length._0_1_ = buf[0];
      length._1_1_ = buf[1];
      length._2_1_ = buf[2];
      length._3_1_ = buf[3];
      (*visitor->_vptr_basic_json_visitor[3])(visitor,0,this,ec);
      this->more_ = (bool)(this->cursor_mode_ ^ 1);
      local_30 = document;
      std::vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>>::
      emplace_back<jsoncons::bson::parse_mode,int&,unsigned_long&>
                ((vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>> *)
                 &this->state_stack_,&local_30,&length,&n);
      return;
    }
    __e = unexpected_eof;
  }
  std::error_code::operator=(ec,__e);
  this->more_ = false;
  return;
}

Assistant:

void begin_document(json_visitor& visitor, std::error_code& ec)
    {
        if (JSONCONS_UNLIKELY(static_cast<int>(state_stack_.size()) > options_.max_nesting_depth()))
        {
            ec = bson_errc::max_nesting_depth_exceeded;
            more_ = false;
            return;
        } 

        uint8_t buf[sizeof(int32_t)]; 
        std::size_t n = source_.read(buf, sizeof(int32_t));
        if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
        {
            ec = bson_errc::unexpected_eof;
            more_ = false;
            return;
        }

        auto length = binary::little_to_native<int32_t>(buf, sizeof(buf));

        visitor.begin_object(semantic_tag::none, *this, ec);
        more_ = !cursor_mode_;
        state_stack_.emplace_back(parse_mode::document,length,n);
    }